

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

float stbir__filter_mitchell(float x,float s,void *user_data)

{
  float fVar1;
  float fVar2;
  
  fVar2 = -x;
  if (-x <= x) {
    fVar2 = x;
  }
  if (fVar2 < 1.0) {
    return ((fVar2 * 21.0 + -36.0) * fVar2 * fVar2 + 16.0) / 18.0;
  }
  fVar1 = 0.0;
  if (fVar2 < 2.0) {
    fVar1 = (((fVar2 * -7.0 + 36.0) * fVar2 + -60.0) * fVar2 + 32.0) / 18.0;
  }
  return fVar1;
}

Assistant:

static float stbir__filter_mitchell(float x, float s, void * user_data)
{
  STBIR__UNUSED(s);
  STBIR__UNUSED(user_data);

  if ( x < 0.0f ) x = -x;

  if (x < 1.0f)
    return (16.0f + x*x*(21.0f * x - 36.0f))/18.0f;
  else if (x < 2.0f)
    return (32.0f + x*(-60.0f + x*(36.0f - 7.0f*x)))/18.0f;

  return (0.0f);
}